

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

DILineInfo * __thiscall
llvm::DWARFContext::getLineInfoForAddress
          (DILineInfo *__return_storage_ptr__,DWARFContext *this,uint64_t param_3,uint64_t param_4,
          undefined8 param_5)

{
  DWARFUnit *U;
  LineTable *this_00;
  char *CompDir;
  SectionedAddress Address;
  
  DILineInfo::DILineInfo(__return_storage_ptr__);
  U = &getCompileUnitForAddress(this,param_3)->super_DWARFUnit;
  if (U != (DWARFUnit *)0x0) {
    getFunctionNameAndStartLineForAddress
              ((DWARFCompileUnit *)U,param_3,(FunctionNameKind)((ulong)param_5 >> 0x20),
               &__return_storage_ptr__->FunctionName,&__return_storage_ptr__->StartLine);
    if ((FileLineInfoKind)param_5 != None) {
      this_00 = getLineTableForUnit(this,U);
      if (this_00 != (LineTable *)0x0) {
        CompDir = DWARFUnit::getCompilationDir(U);
        Address.SectionIndex = param_4;
        Address.Address = param_3;
        DWARFDebugLine::LineTable::getFileLineInfoForAddress
                  (this_00,Address,CompDir,(FileLineInfoKind)param_5,__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DILineInfo DWARFContext::getLineInfoForAddress(object::SectionedAddress Address,
                                               DILineInfoSpecifier Spec) {
  DILineInfo Result;

  DWARFCompileUnit *CU = getCompileUnitForAddress(Address.Address);
  if (!CU)
    return Result;

  getFunctionNameAndStartLineForAddress(CU, Address.Address, Spec.FNKind,
                                        Result.FunctionName, Result.StartLine);
  if (Spec.FLIKind != FileLineInfoKind::None) {
    if (const DWARFLineTable *LineTable = getLineTableForUnit(CU)) {
      LineTable->getFileLineInfoForAddress(
          {Address.Address, Address.SectionIndex}, CU->getCompilationDir(),
          Spec.FLIKind, Result);
    }
  }
  return Result;
}